

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashInt.h
# Opt level: O0

int Hash_IntExists(Hash_Int_t *p,int key)

{
  int iVar1;
  Hash_Int_Entry_t **pLast;
  Hash_Int_Entry_t *pEntry;
  int bin;
  int key_local;
  Hash_Int_t *p_local;
  
  iVar1 = (*p->fHash)(key,p->nBins);
  pLast = (Hash_Int_Entry_t **)p->pArray[iVar1];
  while( true ) {
    if (pLast == (Hash_Int_Entry_t **)0x0) {
      return 0;
    }
    if (*(int *)pLast == key) break;
    pLast = (Hash_Int_Entry_t **)pLast[1];
  }
  return 1;
}

Assistant:

static inline int Hash_IntExists( Hash_Int_t *p, int key)
{
  int bin;
  Hash_Int_Entry_t *pEntry, **pLast;

  // find the bin where this key would live
  bin = (*(p->fHash))(key, p->nBins);

  // search for key
  pLast = &(p->pArray[bin]);
  pEntry = p->pArray[bin];
  while(pEntry) {
    if (pEntry->key == key) {
      return 1;
    }
    pLast = &(pEntry->pNext);
    pEntry = pEntry->pNext;
  }

  return 0;
}